

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::anon_unknown_2::
         LegacyGeneratedClassName<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,EnumDescriptor *desc)

{
  string *psVar1;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Descriptor *local_40;
  Descriptor *containing;
  string classname;
  EnumDescriptor *desc_local;
  
  classname.field_2._8_8_ = desc;
  psVar1 = EnumDescriptor::name_abi_cxx11_(desc);
  std::__cxx11::string::string((string *)&containing,(string *)psVar1);
  for (local_40 = EnumDescriptor::containing_type((EnumDescriptor *)classname.field_2._8_8_);
      local_40 != (Descriptor *)0x0; local_40 = Descriptor::containing_type(local_40)) {
    psVar1 = Descriptor::name_abi_cxx11_(local_40);
    std::operator+(&local_80,psVar1,'_');
    std::operator+(&local_60,&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&containing)
    ;
    std::__cxx11::string::operator=((string *)&containing,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  ClassNamePrefix<google::protobuf::EnumDescriptor>
            (&local_b0,(string *)&containing,(EnumDescriptor *)classname.field_2._8_8_);
  std::operator+(__return_storage_ptr__,&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&containing);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&containing);
  return __return_storage_ptr__;
}

Assistant:

std::string LegacyGeneratedClassName(const DescriptorType* desc) {
  std::string classname = desc->name();
  const Descriptor* containing = desc->containing_type();
  while (containing != NULL) {
    classname = containing->name() + '_' + classname;
    containing = containing->containing_type();
  }
  return ClassNamePrefix(classname, desc) + classname;
}